

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void init_error_limit(j_decompress_ptr cinfo)

{
  jpeg_color_quantizer *pjVar1;
  void *pvVar2;
  _func_void_j_decompress_ptr *p_Var3;
  int local_28;
  uint local_24;
  int out;
  int in;
  int *table;
  my_cquantize_ptr_conflict cquantize;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->cquantize;
  pvVar2 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x7fc);
  p_Var3 = (_func_void_j_decompress_ptr *)((long)pvVar2 + 0x3fc);
  pjVar1[2].finish_pass = p_Var3;
  local_28 = 0;
  for (local_24 = 0; (int)local_24 < 0x10; local_24 = local_24 + 1) {
    *(int *)(p_Var3 + (long)(int)local_24 * 4) = local_28;
    *(int *)(p_Var3 + (long)(int)-local_24 * 4) = -local_28;
    local_28 = local_28 + 1;
  }
  while ((int)local_24 < 0x30) {
    *(int *)(p_Var3 + (long)(int)local_24 * 4) = local_28;
    *(int *)(p_Var3 + (long)(int)-local_24 * 4) = -local_28;
    local_24 = local_24 + 1;
    local_28 = (uint)((local_24 & 1) == 0) + local_28;
  }
  for (; (int)local_24 < 0x100; local_24 = local_24 + 1) {
    *(int *)(p_Var3 + (long)(int)local_24 * 4) = local_28;
    *(int *)(p_Var3 + (long)(int)-local_24 * 4) = -local_28;
  }
  return;
}

Assistant:

LOCAL(void)
init_error_limit (j_decompress_ptr cinfo)
/* Allocate and fill in the error_limiter table */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  int * table;
  int in, out;

  table = (int *) (*cinfo->mem->alloc_small)
    ((j_common_ptr) cinfo, JPOOL_IMAGE, (MAXJSAMPLE*2+1) * SIZEOF(int));
  table += MAXJSAMPLE;		/* so can index -MAXJSAMPLE .. +MAXJSAMPLE */
  cquantize->error_limiter = table;

#define STEPSIZE ((MAXJSAMPLE+1)/16)
  /* Map errors 1:1 up to +- MAXJSAMPLE/16 */
  out = 0;
  for (in = 0; in < STEPSIZE; in++, out++) {
    table[in] = out; table[-in] = -out;
  }
  /* Map errors 1:2 up to +- 3*MAXJSAMPLE/16 */
  for (; in < STEPSIZE*3; in++, out += (in&1) ? 0 : 1) {
    table[in] = out; table[-in] = -out;
  }
  /* Clamp the rest to final out value (which is (MAXJSAMPLE+1)/8) */
  for (; in <= MAXJSAMPLE; in++) {
    table[in] = out; table[-in] = -out;
  }
#undef STEPSIZE
}